

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O3

Result __thiscall
wabt::WastParser::ParseBoundValueTypeList
          (WastParser *this,TokenType token,TypeVector *types,BindingHash *bindings,
          Index binding_index_offset)

{
  iterator __position;
  bool bVar1;
  TokenType TVar2;
  Result RVar3;
  Token local_d8;
  undefined8 uStack_88;
  Location loc;
  undefined1 local_58 [8];
  string name;
  Type type;
  
  name.field_2._8_4_ = binding_index_offset;
  do {
    bVar1 = MatchLpar(this,token);
    if (!bVar1) {
      return (Result)Ok;
    }
    TVar2 = Peek(this,0);
    if (TVar2 == Last_String) {
      local_58 = (undefined1  [8])&name._M_string_length;
      name._M_dataplus._M_p = (pointer)0x0;
      name._M_string_length._0_1_ = 0;
      GetToken(&local_d8,this);
      uStack_88 = CONCAT44(local_d8.loc.filename.data_._4_4_,local_d8.loc.filename.data_._0_4_);
      loc.filename.data_ =
           (char *)CONCAT44(local_d8.loc.filename.size_._4_4_,
                            (undefined4)local_d8.loc.filename.size_);
      loc.filename.size_ =
           CONCAT44(local_d8.loc.field_1.field_0.first_column,local_d8.loc.field_1.field_0.line);
      loc.field_1._4_4_ = local_d8.loc.field_1._12_4_;
      loc.field_1.field_0.line = local_d8.loc.field_1.field_0.last_column;
      Token::~Token(&local_d8);
      ParseBindVarOpt(this,(string *)local_58);
      RVar3 = ParseValueType(this,(Type *)(name.field_2._M_local_buf + 0xc));
      if (RVar3.enum_ != Error) {
        local_d8.token_type_ =
             (int)((ulong)((long)(types->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>
                                 )._M_impl.super__Vector_impl_data._M_finish -
                          (long)(types->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)
                                ._M_impl.super__Vector_impl_data._M_start) >> 2) +
             name.field_2._8_4_;
        local_d8.loc.field_1.field_0.line = (int)loc.filename.size_;
        local_d8.loc.field_1.field_0.first_column = loc.filename.size_._4_4_;
        local_d8.loc.field_1.field_0.last_column = loc.field_1.field_0.line;
        local_d8.loc.field_1._12_4_ = loc.field_1.field_0.first_column;
        local_d8.loc.filename.data_._0_4_ = (undefined4)uStack_88;
        local_d8.loc.filename.data_._4_4_ = uStack_88._4_4_;
        local_d8.loc.filename.size_._0_4_ = loc.filename.data_._0_4_;
        local_d8.loc.filename.size_._4_4_ = loc.filename.data_._4_4_;
        std::
        _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,wabt::Binding>,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>
        ::_M_emplace<std::__cxx11::string&,wabt::Binding>
                  ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,wabt::Binding>,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>
                    *)bindings,0,local_58,&local_d8);
        __position._M_current =
             (types->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (types->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<wabt::Type,std::allocator<wabt::Type>>::_M_realloc_insert<wabt::Type_const&>
                    ((vector<wabt::Type,std::allocator<wabt::Type>> *)types,__position,
                     (Type *)(name.field_2._M_local_buf + 0xc));
        }
        else {
          *__position._M_current = name.field_2._12_4_;
          (types->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
          super__Vector_impl_data._M_finish = __position._M_current + 1;
        }
      }
      if (local_58 != (undefined1  [8])&name._M_string_length) {
        operator_delete((void *)local_58);
      }
    }
    else {
      RVar3 = ParseValueTypeList(this,types);
    }
  } while ((RVar3.enum_ != Error) && (RVar3 = Expect(this,Rpar), RVar3.enum_ != Error));
  return (Result)Error;
}

Assistant:

Result WastParser::ParseBoundValueTypeList(TokenType token,
                                           TypeVector* types,
                                           BindingHash* bindings,
                                           Index binding_index_offset) {
  WABT_TRACE(ParseBoundValueTypeList);
  while (MatchLpar(token)) {
    if (PeekMatch(TokenType::Var)) {
      std::string name;
      Type type;
      Location loc = GetLocation();
      ParseBindVarOpt(&name);
      CHECK_RESULT(ParseValueType(&type));
      bindings->emplace(name,
                        Binding(loc, binding_index_offset + types->size()));
      types->push_back(type);
    } else {
      CHECK_RESULT(ParseValueTypeList(types));
    }
    EXPECT(Rpar);
  }
  return Result::Ok;
}